

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void spr_write_uamor(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 ret;
  TCGv_i64 t2;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  int gprn_local;
  int sprn_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx_00);
  t_00 = tcg_temp_new_i64(tcg_ctx_00);
  ret = tcg_temp_new_i64(tcg_ctx_00);
  gen_load_spr(tcg_ctx_00,t_00,0x15d);
  tcg_gen_and_i64_ppc64(tcg_ctx_00,ret,t_00,cpu_gpr[gprn]);
  gen_load_spr(tcg_ctx_00,t,0x9d);
  tcg_gen_andc_i64_ppc64(tcg_ctx_00,t,t,t_00);
  tcg_gen_or_i64_ppc64(tcg_ctx_00,t,t,ret);
  gen_store_spr(tcg_ctx_00,0x9d,t);
  spr_store_dump_spr(0x9d);
  tcg_temp_free_i64(tcg_ctx_00,t);
  tcg_temp_free_i64(tcg_ctx_00,t_00);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return;
}

Assistant:

static void spr_write_uamor(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    TCGv t2 = tcg_temp_new(tcg_ctx);

    /*
     * Note, the HV=1 case is handled earlier by simply using
     * spr_write_generic for HV mode in the SPR table
     */

    /* Build insertion mask into t1 based on context */
    gen_load_spr(tcg_ctx, t1, SPR_AMOR);

    /* Mask new bits into t2 */
    tcg_gen_and_tl(tcg_ctx, t2, t1, cpu_gpr[gprn]);

    /* Load AMR and clear new bits in t0 */
    gen_load_spr(tcg_ctx, t0, SPR_UAMOR);
    tcg_gen_andc_tl(tcg_ctx, t0, t0, t1);

    /* Or'in new bits and write it out */
    tcg_gen_or_tl(tcg_ctx, t0, t0, t2);
    gen_store_spr(tcg_ctx, SPR_UAMOR, t0);
    spr_store_dump_spr(SPR_UAMOR);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t2);
}